

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution3d.cpp
# Opt level: O1

int __thiscall
ncnn::Convolution3D::forward(Convolution3D *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float fVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  size_t sVar7;
  int *piVar8;
  Mat *pMVar9;
  Convolution3D *pCVar10;
  int iVar11;
  pointer piVar12;
  uint uVar13;
  uint _w;
  ulong uVar14;
  ulong uVar15;
  int iVar16;
  int iVar17;
  ulong uVar18;
  int iVar19;
  int iVar20;
  ulong uVar21;
  long lVar22;
  ulong uVar23;
  long lVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  vector<int,_std::allocator<int>_> _space_ofs;
  Option opt_pad;
  allocator_type local_1a9;
  Mat *local_1a8;
  long local_1a0;
  ulong local_198;
  Convolution3D *local_190;
  ulong local_188;
  ulong local_180;
  ulong local_178;
  float *local_170;
  long local_168;
  Option *local_160;
  size_t local_158;
  int local_14c;
  Mat local_148;
  ulong local_f8;
  ulong local_f0;
  void *local_e8;
  long local_e0;
  long local_d8;
  long local_d0;
  long local_c8;
  ulong local_c0;
  ulong local_b8;
  long local_b0;
  long local_a8;
  vector<int,_std::allocator<int>_> local_a0;
  float local_88;
  undefined4 uStack_84;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  Option local_78;
  
  local_178 = (ulong)(uint)bottom_blob->c;
  sVar7 = bottom_blob->elemsize;
  iVar2 = this->kernel_w;
  iVar3 = this->kernel_h;
  iVar4 = this->dilation_w;
  iVar5 = this->dilation_h;
  iVar6 = this->kernel_d;
  iVar16 = this->dilation_d;
  local_148.cstep = 0;
  local_148.data = (void *)0x0;
  local_148.refcount._0_4_ = 0;
  local_148.refcount._4_4_ = 0;
  local_148.elemsize._0_4_ = 0;
  local_148.elemsize._4_4_ = 0;
  local_148.elempack = 0;
  local_148.allocator = (Allocator *)0x0;
  local_148.dims = 0;
  local_148.w = 0;
  local_148.h = 0;
  local_148.d = 0;
  local_148.c = 0;
  local_78.lightmode = opt->lightmode;
  local_78._1_3_ = *(undefined3 *)&opt->field_0x1;
  local_78.num_threads = opt->num_threads;
  local_78.blob_allocator = opt->blob_allocator;
  local_78.workspace_allocator = opt->workspace_allocator;
  local_78.openmp_blocktime = opt->openmp_blocktime;
  local_78.use_winograd_convolution = opt->use_winograd_convolution;
  local_78.use_sgemm_convolution = opt->use_sgemm_convolution;
  local_78.use_int8_inference = opt->use_int8_inference;
  local_78.use_vulkan_compute = opt->use_vulkan_compute;
  uVar21._0_1_ = opt->use_bf16_storage;
  uVar21._1_1_ = opt->use_fp16_packed;
  uVar21._2_1_ = opt->use_fp16_storage;
  uVar21._3_1_ = opt->use_fp16_arithmetic;
  uVar21._4_1_ = opt->use_int8_packed;
  uVar21._5_1_ = opt->use_int8_storage;
  uVar21._6_1_ = opt->use_int8_arithmetic;
  uVar21._7_1_ = opt->use_packing_layout;
  local_78.use_shader_pack8 = opt->use_shader_pack8;
  local_78.use_subgroup_basic = opt->use_subgroup_basic;
  local_78.use_subgroup_vote = opt->use_subgroup_vote;
  local_78.use_subgroup_ballot = opt->use_subgroup_ballot;
  local_78.use_subgroup_shuffle = opt->use_subgroup_shuffle;
  local_78.use_image_storage = opt->use_image_storage;
  local_78.use_tensor_storage = opt->use_tensor_storage;
  local_78.use_reserved_0 = opt->use_reserved_0;
  local_78.flush_denormals = opt->flush_denormals;
  local_78.use_local_pool_allocator = opt->use_local_pool_allocator;
  local_78.use_shader_local_memory = opt->use_shader_local_memory;
  local_78.use_cooperative_matrix = opt->use_cooperative_matrix;
  local_78.use_winograd23_convolution = opt->use_winograd23_convolution;
  local_78.use_winograd43_convolution = opt->use_winograd43_convolution;
  local_78.use_winograd63_convolution = opt->use_winograd63_convolution;
  local_78.use_a53_a55_optimized_kernel = opt->use_a53_a55_optimized_kernel;
  local_78.use_reserved_7 = opt->use_reserved_7;
  local_78.use_reserved_8 = opt->use_reserved_8;
  local_78.use_reserved_9 = opt->use_reserved_9;
  local_78.use_reserved_10 = opt->use_reserved_10;
  local_78.use_reserved_11 = opt->use_reserved_11;
  local_78._32_8_ = uVar21 & 0xffffffffffffff;
  local_1a8 = top_blob;
  local_190 = this;
  make_padding(this,bottom_blob,&local_148,&local_78);
  iVar11 = local_148.h;
  pCVar10 = local_190;
  iVar17 = -100;
  if ((local_148.data != (void *)0x0) && ((long)local_148.c * local_148.cstep != 0)) {
    local_168 = CONCAT44(local_168._4_4_,local_148.w);
    uVar21 = (long)(~((iVar2 + -1) * iVar4) + local_148.w) / (long)local_190->stride_w;
    uVar14 = uVar21 & 0xffffffff;
    uVar23 = (long)(~((iVar3 + -1) * iVar5) + local_148.h) / (long)local_190->stride_h;
    uVar18 = uVar23 & 0xffffffff;
    uVar15 = (long)(~((iVar6 + -1) * iVar16) + local_148.d) / (long)local_190->stride_d;
    uVar13 = local_190->kernel_w * local_190->kernel_h * local_190->kernel_d;
    local_160 = opt;
    local_158 = sVar7;
    std::vector<int,_std::allocator<int>_>::vector(&local_a0,(long)(int)uVar13,&local_1a9);
    piVar12 = local_a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start;
    pMVar9 = local_1a8;
    _w = (int)uVar21 + 1;
    if (0 < pCVar10->kernel_d) {
      iVar2 = pCVar10->dilation_w;
      iVar3 = pCVar10->dilation_h;
      iVar4 = pCVar10->kernel_w;
      iVar5 = pCVar10->kernel_h;
      iVar6 = pCVar10->dilation_d;
      iVar16 = 0;
      iVar17 = 0;
      iVar19 = 0;
      do {
        if (0 < pCVar10->kernel_h) {
          iVar20 = 0;
          do {
            if (0 < pCVar10->kernel_w) {
              lVar22 = 0;
              do {
                local_a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[iVar19 + lVar22] = iVar17;
                iVar17 = iVar17 + pCVar10->dilation_w;
                lVar22 = lVar22 + 1;
              } while ((int)lVar22 < pCVar10->kernel_w);
              iVar19 = iVar19 + (int)lVar22;
            }
            iVar17 = iVar17 + (iVar3 * (int)local_168 - iVar2 * iVar4);
            iVar20 = iVar20 + 1;
          } while (iVar20 < pCVar10->kernel_h);
        }
        iVar17 = iVar17 + (iVar11 * iVar6 - iVar3 * iVar5) * (int)local_168;
        iVar16 = iVar16 + 1;
      } while (iVar16 < pCVar10->kernel_d);
    }
    local_f8 = uVar15 & 0xffffffff;
    Mat::create(local_1a8,_w,(int)uVar23 + 1,(int)uVar15 + 1,pCVar10->num_output,local_158,
                local_160->blob_allocator);
    iVar17 = -100;
    if ((pMVar9->data != (void *)0x0) && ((long)pMVar9->c * pMVar9->cstep != 0)) {
      local_d8 = (long)pCVar10->num_output;
      if (0 < local_d8) {
        local_e0 = pMVar9->cstep * pMVar9->elemsize;
        local_e8 = pMVar9->data;
        local_c8 = (long)(int)_w;
        uVar23 = (ulong)_w;
        local_14c = (int)local_178 * uVar13;
        local_198 = 0;
        local_1a0 = 0;
        uVar21 = local_178;
        local_f0 = uVar23;
        local_c0 = uVar18;
        local_b8 = uVar14;
        do {
          if (-1 < (int)local_f8) {
            local_d0 = (long)(int)local_198 << 2;
            local_1a8 = (Mat *)(local_e0 * local_1a0 + (long)local_e8);
            local_188 = 0;
            do {
              if (-1 < (int)uVar18) {
                iVar2 = local_190->bias_term;
                local_b0 = (long)(local_190->weight_data).data + local_d0;
                local_180 = 0;
                local_158 = (size_t)(local_190->activation_type - 1);
                do {
                  if (-1 < (int)uVar14) {
                    local_170 = (float *)(local_190->activation_params).data;
                    local_160 = (Option *)(local_190->bias_data).data;
                    lVar22 = (long)local_148.w *
                             CONCAT44(local_148.elemsize._4_4_,(undefined4)local_148.elemsize);
                    lVar24 = local_148.cstep *
                             CONCAT44(local_148.elemsize._4_4_,(undefined4)local_148.elemsize);
                    local_168 = (long)local_148.data +
                                (long)(int)local_180 * (long)local_190->stride_h * lVar22 +
                                local_148.h * lVar22 *
                                (long)(int)local_188 * (long)local_190->stride_d;
                    local_a8 = (long)local_190->stride_w;
                    uVar15 = 0;
                    do {
                      if (iVar2 == 0) {
                        fVar27 = 0.0;
                      }
                      else {
                        fVar27 = *(float *)(&local_160->lightmode + local_1a0 * 4);
                      }
                      if (0 < (int)uVar21) {
                        uVar14 = 0;
                        lVar22 = local_b0;
                        do {
                          if (0 < (int)uVar13) {
                            uVar18 = 0;
                            do {
                              fVar27 = fVar27 + *(float *)(lVar22 + uVar18 * 4) *
                                                *(float *)(local_168 +
                                                          (long)piVar12[uVar18] * 4 +
                                                          lVar24 * uVar14 + uVar15 * local_a8 * 4);
                              uVar18 = uVar18 + 1;
                            } while (uVar13 != uVar18);
                          }
                          uVar14 = uVar14 + 1;
                          lVar22 = lVar22 + (long)(int)uVar13 * 4;
                        } while (uVar14 != uVar21);
                      }
                      fVar25 = fVar27;
                      if ((uint)local_158 < 6) {
                        switch((long)&switchD_005425a2::switchdataD_005a36e4 +
                               (long)(int)(&switchD_005425a2::switchdataD_005a36e4)[local_158]) {
                        case 0x5425a4:
                          if (fVar27 <= 0.0) {
                            fVar25 = 0.0;
                          }
                          break;
                        case 0x5425b4:
                          uStack_84 = 0;
                          uStack_80 = 0;
                          uStack_7c = 0;
                          local_88 = fVar27;
                          fVar27 = expf(fVar27);
                          fVar27 = logf(fVar27 + 1.0);
                          fVar27 = tanhf(fVar27);
                          uVar21 = local_178;
                          uVar23 = local_f0;
                          fVar25 = fVar27 * local_88;
                          break;
                        case 0x5425f8:
                          if (fVar27 <= *local_170) {
                            fVar27 = *local_170;
                          }
                          fVar25 = local_170[1];
                          if (fVar27 <= local_170[1]) {
                            fVar25 = fVar27;
                          }
                          break;
                        case 0x542617:
                          if (88.37626 <= fVar27) {
                            fVar27 = 88.37626;
                          }
                          fVar27 = expf((float)(-(uint)(fVar27 < -88.37626) & 0x42b0c0a5 |
                                               ~-(uint)(fVar27 < -88.37626) & (uint)-fVar27));
                          uVar21 = local_178;
                          uVar23 = local_f0;
                          fVar25 = 1.0 / (fVar27 + 1.0);
                          break;
                        case 0x542673:
                          fVar25 = (float)(~-(uint)(0.0 < fVar27) & (uint)*local_170 |
                                          -(uint)(0.0 < fVar27) & 0x3f800000) * fVar27;
                          break;
                        case 0x54269e:
                          fVar1 = *local_170;
                          fVar26 = -local_170[1] / fVar1;
                          fVar25 = 0.0;
                          if ((fVar26 <= fVar27) &&
                             (fVar25 = fVar27, fVar27 <= fVar26 + 1.0 / fVar1)) {
                            fVar25 = (fVar1 * fVar27 + local_170[1]) * fVar27;
                          }
                        }
                      }
                      *(float *)((long)&local_1a8->data + uVar15 * 4) = fVar25;
                      uVar15 = uVar15 + 1;
                    } while (uVar15 != uVar23);
                  }
                  local_1a8 = (Mat *)((long)&local_1a8->data + local_c8 * 4);
                  iVar3 = (int)local_180;
                  local_180 = (ulong)(iVar3 + 1);
                  uVar14 = local_b8;
                  uVar18 = local_c0;
                } while (iVar3 != (int)local_c0);
              }
              iVar2 = (int)local_188;
              local_188 = (ulong)(iVar2 + 1);
            } while (iVar2 != (int)local_f8);
          }
          local_1a0 = local_1a0 + 1;
          local_198 = (ulong)(uint)((int)local_198 + local_14c);
        } while (local_1a0 != local_d8);
      }
      iVar17 = 0;
    }
    if (local_a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  piVar8 = (int *)CONCAT44(local_148.refcount._4_4_,local_148.refcount._0_4_);
  if (piVar8 != (int *)0x0) {
    LOCK();
    *piVar8 = *piVar8 + -1;
    UNLOCK();
    if (*piVar8 == 0) {
      if (local_148.allocator == (Allocator *)0x0) {
        if (local_148.data != (void *)0x0) {
          free(local_148.data);
        }
      }
      else {
        (*(local_148.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar17;
}

Assistant:

int Convolution3D::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;

    const int kernel_extend_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extend_h = dilation_h * (kernel_h - 1) + 1;
    const int kernel_extend_d = dilation_d * (kernel_d - 1) + 1;

    Mat bottom_blob_bordered;
    Option opt_pad = opt;
    opt_pad.use_packing_layout = false;
    make_padding(bottom_blob, bottom_blob_bordered, opt_pad);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;
    h = bottom_blob_bordered.h;
    d = bottom_blob_bordered.d;

    int outw = (w - kernel_extend_w) / stride_w + 1;
    int outh = (h - kernel_extend_h) / stride_h + 1;
    int outd = (d - kernel_extend_d) / stride_d + 1;

    const int maxk = kernel_w * kernel_h * kernel_d;

    // kernel offsets
    std::vector<int> _space_ofs(maxk);
    int* space_ofs = &_space_ofs[0];
    {
        int p1 = 0;
        int p2 = 0;
        int gap0 = w * dilation_h - kernel_w * dilation_w;
        int gap1 = h * w * dilation_d - w * kernel_h * dilation_h;
        for (int z = 0; z < kernel_d; z++)
        {
            for (int i = 0; i < kernel_h; i++)
            {
                for (int j = 0; j < kernel_w; j++)
                {
                    space_ofs[p1] = p2;
                    p1++;
                    p2 += dilation_w;
                }
                p2 += gap0;
            }
            p2 += gap1;
        }
    }

    top_blob.create(outw, outh, outd, num_output, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < num_output; p++)
    {
        float* outptr = top_blob.channel(p);

        for (int z = 0; z < outd; z++)
        {
            for (int i = 0; i < outh; i++)
            {
                for (int j = 0; j < outw; j++)
                {
                    float sum = 0.f;

                    if (bias_term)
                        sum = bias_data[p];

                    const float* kptr = (const float*)weight_data + maxk * channels * p;

                    for (int q = 0; q < channels; q++)
                    {
                        const Mat m = bottom_blob_bordered.channel(q);
                        const float* sptr = m.depth(z * stride_d).row(i * stride_h) + j * stride_w;

                        for (int l = 0; l < maxk; l++)
                        {
                            float val = sptr[space_ofs[l]];

                            float wt = kptr[l];
                            sum += val * wt;
                        }

                        kptr += maxk;
                    }

                    outptr[j] = activation_ss(sum, activation_type, activation_params);
                }

                outptr += outw;
            }
        }
    }

    return 0;
}